

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *
deqp::gles31::bb::anon_unknown_11::blockLocationsToPtrs
          (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
           *__return_storage_ptr__,BufferLayout *layout,
          vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
          *blockLocations,vector<void_*,_std::allocator<void_*>_> *bufPtrs)

{
  pointer pBVar1;
  pointer pBVar2;
  vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_> *pvVar3;
  long lVar4;
  long lVar5;
  pointer pBVar6;
  long lVar7;
  long lVar8;
  BlockDataPtr BVar9;
  allocator_type local_41;
  vector<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
  *local_40;
  vector<void_*,_std::allocator<void_*>_> *local_38;
  
  local_40 = blockLocations;
  local_38 = bufPtrs;
  std::vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>::
  vector(__return_storage_ptr__,
         ((long)(blockLocations->
                super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(blockLocations->
                super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,&local_41);
  pBVar6 = (layout->blocks).
           super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
            *)((ulong)((long)(layout->blocks).
                             super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6) >> 6);
  if (0 < (int)pvVar3) {
    lVar7 = 2;
    lVar5 = 0;
    lVar4 = 2;
    lVar8 = 0;
    do {
      pBVar1 = (local_40->
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::BlockLocation,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::BlockLocation>_>
               )._M_impl.super__Vector_impl_data._M_start;
      BVar9 = getBlockDataPtr((BufferLayout *)
                              (layout->bufferVars).
                              super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (BlockLayoutEntry *)((long)&(pBVar6->name)._M_dataplus + lVar5),
                              (void *)((long)*(int *)((long)pBVar1 + lVar7 * 4 + -4) +
                                      (long)(local_38->
                                            super__Vector_base<void_*,_std::allocator<void_*>_>).
                                            _M_impl.super__Vector_impl_data._M_start
                                            [*(int *)((long)pBVar1 + lVar7 * 4 + -8)]),
                              (&pBVar1->index)[lVar7]);
      pBVar2 = (__return_storage_ptr__->
               super__Vector_base<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(void **)((long)pBVar2 + lVar4 * 4 + -8) = BVar9.ptr;
      *(long *)((long)&pBVar2->ptr + lVar4 * 4) = BVar9._8_8_;
      lVar8 = lVar8 + 1;
      pBVar6 = (layout->blocks).
               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
                *)(long)(int)((ulong)((long)(layout->blocks).
                                            super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar6) >> 6);
      lVar4 = lVar4 + 4;
      lVar7 = lVar7 + 3;
      lVar5 = lVar5 + 0x40;
    } while (lVar8 < (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

vector<BlockDataPtr> blockLocationsToPtrs (const BufferLayout& layout, const vector<BlockLocation>& blockLocations, const vector<void*>& bufPtrs)
{
	vector<BlockDataPtr> blockPtrs(blockLocations.size());

	DE_ASSERT(layout.blocks.size() == blockLocations.size());

	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
		const BlockLocation&	location		= blockLocations[blockNdx];

		blockPtrs[blockNdx] = getBlockDataPtr(layout, blockLayout, (deUint8*)bufPtrs[location.index] + location.offset, location.size);
	}

	return blockPtrs;
}